

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<unsigned_long_long>>
               (GetterXsYs<unsigned_long_long> getter,TransformerLogLog transformer,
               ImDrawList *DrawList,ImPlotMarker marker,float size,bool rend_mk_line,
               ImU32 col_mk_line,float weight,bool rend_mk_fill,ImU32 col_mk_fill)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  long lVar5;
  int iVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  ImVec2 c;
  ImVec2 local_a8;
  uint local_9c;
  uint local_98;
  float local_94;
  ImU32 local_90;
  float local_8c;
  long local_88;
  ImDrawList *local_80;
  long local_78;
  ulong local_70;
  unsigned_long_long *local_68;
  unsigned_long_long *local_60;
  ImPlotContext *local_58;
  double local_50;
  undefined1 local_48 [16];
  
  if (0 < getter.Count) {
    local_58 = GImPlot;
    local_60 = getter.Xs;
    local_68 = getter.Ys;
    local_70 = (ulong)(uint)getter.Offset;
    local_78 = (long)getter.Stride;
    local_88 = (long)marker;
    iVar6 = 0;
    local_98 = (uint)rend_mk_line;
    local_9c = (uint)rend_mk_fill;
    local_94 = size;
    local_90 = col_mk_line;
    local_8c = weight;
    local_80 = DrawList;
    do {
      pIVar4 = GImPlot;
      lVar5 = ((((int)local_70 + iVar6) % getter.Count + getter.Count) % getter.Count) * local_78;
      uVar1 = *(unsigned_long_long *)((long)local_60 + lVar5);
      uVar2 = *(unsigned_long_long *)((long)local_68 + lVar5);
      dVar9 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
      local_48._8_4_ = SUB84(dVar9,0);
      local_48._0_8_ = dVar9 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      local_48._12_4_ = (int)((ulong)dVar9 >> 0x20);
      dVar9 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                    (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar3 = pIVar4->CurrentPlot;
      local_50 = (pIVar3->XAxis).Range.Min;
      local_50 = (double)(float)(dVar9 / pIVar4->LogDenX) * ((pIVar3->XAxis).Range.Max - local_50) +
                 local_50;
      dVar8 = log10((double)local_48._0_8_ / pIVar3->YAxis[transformer.YAxis].Range.Min);
      pIVar3 = pIVar4->CurrentPlot;
      dVar9 = pIVar3->YAxis[transformer.YAxis].Range.Min;
      fVar10 = (float)((local_50 - (pIVar3->XAxis).Range.Min) * pIVar4->Mx +
                      (double)pIVar4->PixelRange[transformer.YAxis].Min.x);
      fVar7 = (float)((((double)(float)(dVar8 / pIVar4->LogDenY[transformer.YAxis]) *
                        (pIVar3->YAxis[transformer.YAxis].Range.Max - dVar9) + dVar9) - dVar9) *
                      pIVar4->My[transformer.YAxis] +
                     (double)pIVar4->PixelRange[transformer.YAxis].Min.y);
      local_a8.y = fVar7;
      local_a8.x = fVar10;
      pIVar3 = local_58->CurrentPlot;
      if (((((pIVar3->PlotRect).Min.x <= fVar10) && ((pIVar3->PlotRect).Min.y <= fVar7)) &&
          (fVar10 < (pIVar3->PlotRect).Max.x)) && (fVar7 < (pIVar3->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterXsYs<unsigned_long_long>_>::
          marker_table[local_88])
                  (local_80,&local_a8,local_94,SUB41(local_98,0),local_90,SUB41(local_9c,0),
                   col_mk_fill,local_8c);
      }
      iVar6 = iVar6 + 1;
    } while (getter.Count != iVar6);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}